

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

int is_mode_coeff_dv_upd_freq_tile_or_off(AV1_COMP *cpi)

{
  bool local_11;
  INTER_MODE_SPEED_FEATURES *inter_sf;
  AV1_COMP *cpi_local;
  
  local_11 = false;
  if (((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET) &&
     (local_11 = false, (cpi->sf).inter_sf.mode_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
    local_11 = (cpi->sf).intra_sf.dv_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET;
  }
  return (int)local_11;
}

Assistant:

static inline int is_mode_coeff_dv_upd_freq_tile_or_off(
    const AV1_COMP *const cpi) {
  const INTER_MODE_SPEED_FEATURES *const inter_sf = &cpi->sf.inter_sf;

  return (inter_sf->coeff_cost_upd_level <= INTERNAL_COST_UPD_TILE &&
          inter_sf->mode_cost_upd_level <= INTERNAL_COST_UPD_TILE &&
          cpi->sf.intra_sf.dv_cost_upd_level <= INTERNAL_COST_UPD_TILE);
}